

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int readsTable(Parse *p,int iStartAddr,int iDb,Table *pTab)

{
  Vdbe *pVVar1;
  undefined4 in_register_00000014;
  long lVar2;
  long *plVar3;
  ulong uVar4;
  Op *pOVar5;
  long lVar6;
  
  lVar2 = CONCAT44(in_register_00000014,iDb);
  pVVar1 = sqlite3GetVdbe(p);
  if ((*(byte *)(lVar2 + 0x46) & 0x10) == 0) {
    plVar3 = (long *)0x0;
  }
  else {
    plVar3 = *(long **)(lVar2 + 0x58);
    if (plVar3 != (long *)0x0) {
      do {
        if ((sqlite3 *)*plVar3 == p->db) break;
        plVar3 = (long *)plVar3[5];
      } while (plVar3 != (long *)0x0);
    }
  }
  if (0 < pVVar1->nOp) {
    uVar4 = 0;
    do {
      pOVar5 = (Op *)&sqlite3VdbeGetOp_dummy;
      if (pVVar1->db->mallocFailed == '\0') {
        pOVar5 = pVVar1->aOp + uVar4;
      }
      if (pOVar5->opcode == 0x87) {
        if ((long *)(pOVar5->p4).p == plVar3) {
          return 1;
        }
      }
      else if ((pOVar5->opcode == '\'') && (pOVar5->p3 == iStartAddr)) {
        if (pOVar5->p2 == *(int *)(lVar2 + 0x3c)) {
          return 1;
        }
        for (lVar6 = *(long *)(lVar2 + 0x10); lVar6 != 0; lVar6 = *(long *)(lVar6 + 0x28)) {
          if (pOVar5->p2 == *(int *)(lVar6 + 0x48)) {
            return 1;
          }
        }
      }
      uVar4 = uVar4 + 1;
    } while (uVar4 != (uint)pVVar1->nOp);
  }
  return 0;
}

Assistant:

static int readsTable(Parse *p, int iStartAddr, int iDb, Table *pTab){
  Vdbe *v = sqlite3GetVdbe(p);
  int i;
  int iEnd = sqlite3VdbeCurrentAddr(v);
#ifndef SQLITE_OMIT_VIRTUALTABLE
  VTable *pVTab = IsVirtual(pTab) ? sqlite3GetVTable(p->db, pTab) : 0;
#endif

  for(i=iStartAddr; i<iEnd; i++){
    VdbeOp *pOp = sqlite3VdbeGetOp(v, i);
    assert( pOp!=0 );
    if( pOp->opcode==OP_OpenRead && pOp->p3==iDb ){
      Index *pIndex;
      int tnum = pOp->p2;
      if( tnum==pTab->tnum ){
        return 1;
      }
      for(pIndex=pTab->pIndex; pIndex; pIndex=pIndex->pNext){
        if( tnum==pIndex->tnum ){
          return 1;
        }
      }
    }
#ifndef SQLITE_OMIT_VIRTUALTABLE
    if( pOp->opcode==OP_VOpen && pOp->p4.pVtab==pVTab ){
      assert( pOp->p4.pVtab!=0 );
      assert( pOp->p4type==P4_VTAB );
      return 1;
    }
#endif
  }
  return 0;
}